

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool __thiscall ON_wString::ContainsNoCase(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *__needle;
  wchar_t *pwVar1;
  ON_wString s2;
  ON_wString s1;
  ON_wString local_28;
  ON_wString local_20;
  
  ON_wString(&local_20,this);
  MakeLowerOrdinal(&local_20);
  ON_wString(&local_28,wszSub);
  MakeLowerOrdinal(&local_28);
  pwVar1 = local_20.m_s;
  if (local_20.m_s == &empty_wstring.s) {
    pwVar1 = L"";
  }
  if (local_20.m_s == (wchar_t *)0x0) {
    pwVar1 = L"";
  }
  __needle = local_28.m_s;
  if (local_28.m_s == &empty_wstring.s) {
    __needle = L"";
  }
  if (local_28.m_s == (wchar_t *)0x0) {
    __needle = L"";
  }
  pwVar1 = wcsstr(pwVar1,__needle);
  ~ON_wString(&local_28);
  ~ON_wString(&local_20);
  return pwVar1 != (wchar_t *)0x0;
}

Assistant:

bool ON_wString::ContainsNoCase(const wchar_t* wszSub) const
{
  ON_wString s1 = *this;
  s1.MakeLowerOrdinal();
  ON_wString s2 = wszSub;
  s2.MakeLowerOrdinal();
  if (nullptr != wcsstr(s1, s2))
    return true;

  return false;
}